

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_yinelem(lysp_ctx *ctx,lysp_stmt *stmt,uint16_t *flags,lysp_ext_instance **exts)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  LY_ERR LVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ly_ctx *plVar8;
  lysp_stmt *stmt_00;
  
  uVar1 = *flags;
  if ((uVar1 & 0x180) == 0) {
    pcVar6 = stmt->arg;
    iVar3 = strcmp(pcVar6,"true");
    if (iVar3 == 0) {
      uVar2 = 0x80;
    }
    else {
      iVar3 = strcmp(pcVar6,"false");
      if (iVar3 != 0) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        sVar5 = strlen(pcVar6);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                sVar5 & 0xffffffff,pcVar6,"yin-element");
        goto LAB_0016f9a6;
      }
      uVar2 = 0x100;
    }
    *flags = uVar2 | uVar1;
    for (stmt_00 = stmt->child; stmt_00 != (lysp_stmt *)0x0; stmt_00 = stmt_00->next) {
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(stmt_00->kw);
        pcVar7 = lyplg_ext_stmt2str(LY_STMT_YIN_ELEMENT);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar6,pcVar7);
        goto LAB_0016f9a6;
      }
      LVar4 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,0,exts);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
    LVar4 = LY_SUCCESS;
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","yin-element");
LAB_0016f9a6:
    LVar4 = LY_EVALID;
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_yinelem(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint16_t *flags, struct lysp_ext_instance **exts)
{
    if (*flags & LYS_YINELEM_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yin-element");
        return LY_EVALID;
    }

    /* store flag */
    if (!strcmp(stmt->arg, "true")) {
        *flags |= LYS_YINELEM_TRUE;
    } else if (!strcmp(stmt->arg, "false")) {
        *flags |= LYS_YINELEM_FALSE;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)strlen(stmt->arg), stmt->arg, "yin-element");
        return LY_EVALID;
    }

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_YIN_ELEMENT));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}